

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  uint uVar1;
  int iVar2;
  LookasideSlot *pLVar3;
  int iVar4;
  int iVar5;
  LookasideSlot *pLVar6;
  u32 uVar7;
  u64 n;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  iVar2 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar2) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar9 = sz & 0xfffffff8;
  iVar2 = 0;
  uVar8 = uVar9;
  if ((int)uVar9 < 9) {
    uVar8 = 0;
  }
  if (cnt < 1 || (int)uVar9 < 9) {
    pLVar3 = (LookasideSlot *)0x0;
    uVar8 = 0;
    iVar4 = 0;
  }
  else {
    n = (long)cnt * (long)sz;
    pLVar3 = (LookasideSlot *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pLVar3 = (LookasideSlot *)sqlite3Malloc(n);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pLVar3 == (LookasideSlot *)0x0) {
        pLVar3 = (LookasideSlot *)0x0;
      }
      else {
        iVar2 = (*sqlite3Config.m.xSize)(pLVar3);
        n = (u64)iVar2;
      }
    }
    iVar2 = 0;
    if ((uint)sz < 0x180) {
      if ((uint)sz < 0x100) {
        iVar4 = (int)((long)n / (long)(ulong)uVar9);
        goto LAB_00153991;
      }
      uVar1 = uVar9 + 0x80;
    }
    else {
      uVar1 = uVar9 + 0x180;
    }
    iVar4 = (int)((long)n / (long)(ulong)uVar1);
    iVar2 = (int)((long)(n - (long)(int)(uVar9 * iVar4)) / 0x80);
  }
LAB_00153991:
  (db->lookaside).pStart = pLVar3;
  (db->lookaside).pInit = (LookasideSlot *)0x0;
  (db->lookaside).pFree = (LookasideSlot *)0x0;
  (db->lookaside).sz = (u16)uVar8;
  (db->lookaside).szTrue = (u16)uVar8;
  if (pLVar3 == (LookasideSlot *)0x0) {
    (db->lookaside).pMiddle = (void *)0x0;
    (db->lookaside).pStart = (void *)0x0;
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pEnd = (void *)0x0;
    (db->lookaside).bDisable = 1;
    (db->lookaside).sz = 0;
    (db->lookaside).bMalloced = '\0';
    uVar7 = 0;
    pLVar3 = (LookasideSlot *)0x0;
  }
  else {
    pLVar6 = (LookasideSlot *)0x0;
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
      pLVar3->pNext = pLVar6;
      (db->lookaside).pInit = pLVar3;
      pLVar6 = pLVar3;
      pLVar3 = (LookasideSlot *)((long)&pLVar3->pNext + (ulong)uVar8);
    }
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pMiddle = pLVar3;
    pLVar6 = (LookasideSlot *)0x0;
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
      pLVar3->pNext = pLVar6;
      (db->lookaside).pSmallInit = pLVar3;
      pLVar6 = pLVar3;
      pLVar3 = pLVar3 + 0x10;
    }
    (db->lookaside).pEnd = pLVar3;
    (db->lookaside).bDisable = 0;
    (db->lookaside).bMalloced = pBuf == (void *)0x0;
    uVar7 = iVar2 + iVar4;
  }
  (db->lookaside).nSlot = uVar7;
  (db->lookaside).pTrueEnd = pLVar3;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc = sz*(sqlite3_int64)cnt;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = 0;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = 0;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = 0;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  db->lookaside.pTrueEnd = db->lookaside.pEnd;
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}